

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util.cc
# Opt level: O0

void __thiscall libwebm::TempFileDeleter::TempFileDeleter(TempFileDeleter *this)

{
  string local_30 [32];
  TempFileDeleter *local_10;
  TempFileDeleter *this_local;
  
  local_10 = this;
  std::__cxx11::string::string((string *)this);
  GetTempFileName_abi_cxx11_();
  std::__cxx11::string::operator=((string *)this,local_30);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

TempFileDeleter::TempFileDeleter() { file_name_ = GetTempFileName(); }